

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r,uint32_t min,uint32_t max)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  uint in_EDX;
  uint in_ESI;
  roaring_array_t *in_RDI;
  uint8_t new_type;
  container_t *new_container;
  uint32_t container_max;
  uint32_t container_min;
  uint32_t key;
  int32_t dst;
  int32_t src;
  int32_t common_length;
  int32_t prefix_length;
  int32_t suffix_length;
  int32_t num_required_containers;
  uint32_t max_key;
  uint32_t min_key;
  roaring_array_t *ra;
  int32_t in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  uint16_t in_stack_ffffffffffffffa2;
  int32_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  uint8_t in_stack_ffffffffffffffaf;
  container_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint local_3c;
  int local_38;
  int local_34;
  uint uVar7;
  roaring_array_t *c;
  
  if (in_ESI <= in_EDX) {
    uVar1 = in_ESI >> 0x10;
    local_3c = in_EDX >> 0x10;
    iVar2 = local_3c - uVar1;
    c = in_RDI;
    iVar3 = count_greater((uint16_t *)
                          CONCAT17(in_stack_ffffffffffffffaf,
                                   CONCAT16(in_stack_ffffffffffffffae,
                                            CONCAT24(in_stack_ffffffffffffffac,
                                                     in_stack_ffffffffffffffa8))),
                          in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa2);
    iVar4 = count_less((uint16_t *)
                       CONCAT17(in_stack_ffffffffffffffaf,
                                CONCAT16(in_stack_ffffffffffffffae,
                                         CONCAT24(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8))),
                       in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa2);
    iVar5 = (in_RDI->size - iVar4) - iVar3;
    if (iVar5 < iVar2 + 1) {
      ra_shift_tail((roaring_array_t *)
                    CONCAT44(in_stack_ffffffffffffffa4,
                             CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                    in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    }
    local_34 = iVar4 + iVar5 + -1;
    local_38 = in_RDI->size - iVar3;
    uVar7 = local_3c;
    for (; local_38 = local_38 + -1, local_3c != uVar1 - 1; local_3c = local_3c - 1) {
      if (uVar7 == local_3c) {
        uVar6 = in_EDX & 0xffff;
      }
      else {
        uVar6 = 0xffff;
      }
      if ((local_34 < 0) || (in_RDI->keys[local_34] != local_3c)) {
        in_stack_ffffffffffffffb0 =
             container_from_range
                       ((uint8_t *)CONCAT44(uVar6,in_stack_ffffffffffffffb8),
                        (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (uint32_t)in_stack_ffffffffffffffb0,
                        CONCAT11(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffae));
      }
      else {
        ra_unshare_container_at_index
                  ((roaring_array_t *)
                   CONCAT44(uVar6,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
                   (uint16_t)((uint)in_stack_ffffffffffffff9c >> 0x10));
        in_stack_ffffffffffffffb0 =
             container_add_range(c,(uint8_t)(in_ESI >> 0x18),in_EDX,
                                 (uint32_t)((ulong)in_RDI >> 0x20),(uint8_t *)CONCAT44(uVar1,uVar7))
        ;
        if (in_stack_ffffffffffffffb0 != in_RDI->containers[local_34]) {
          container_free((container_t *)
                         CONCAT44(uVar6,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0
                                                )),
                         (uint8_t)((uint)in_stack_ffffffffffffff9c >> 0x18));
        }
        local_34 = local_34 + -1;
      }
      ra_replace_key_and_container_at_index
                (in_RDI,local_38,(uint16_t)local_3c,in_stack_ffffffffffffffb0,
                 in_stack_ffffffffffffffaf);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_add_range_closed(roaring_bitmap_t *r, uint32_t min,
                                     uint32_t max) {
    if (min > max) {
        return;
    }

    roaring_array_t *ra = &r->high_low_container;

    uint32_t min_key = min >> 16;
    uint32_t max_key = max >> 16;

    int32_t num_required_containers = max_key - min_key + 1;
    int32_t suffix_length =
        count_greater(ra->keys, ra->size, (uint16_t)max_key);
    int32_t prefix_length =
        count_less(ra->keys, ra->size - suffix_length, (uint16_t)min_key);
    int32_t common_length = ra->size - prefix_length - suffix_length;

    if (num_required_containers > common_length) {
        ra_shift_tail(ra, suffix_length,
                      num_required_containers - common_length);
    }

    int32_t src = prefix_length + common_length - 1;
    int32_t dst = ra->size - suffix_length - 1;
    for (uint32_t key = max_key; key != min_key - 1;
         key--) {  // beware of min_key==0
        uint32_t container_min = (min_key == key) ? (min & 0xffff) : 0;
        uint32_t container_max = (max_key == key) ? (max & 0xffff) : 0xffff;
        container_t *new_container;
        uint8_t new_type;

        if (src >= 0 && ra->keys[src] == key) {
            ra_unshare_container_at_index(ra, (uint16_t)src);
            new_container =
                container_add_range(ra->containers[src], ra->typecodes[src],
                                    container_min, container_max, &new_type);
            if (new_container != ra->containers[src]) {
                container_free(ra->containers[src], ra->typecodes[src]);
            }
            src--;
        } else {
            new_container = container_from_range(&new_type, container_min,
                                                 container_max + 1, 1);
        }
        ra_replace_key_and_container_at_index(ra, dst, (uint16_t)key,
                                              new_container, new_type);
        dst--;
    }
}